

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O2

vrna_exp_param_t * get_scaled_exp_params(vrna_md_t *md,double pfs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  int iVar6;
  vrna_exp_param_t *pvVar7;
  char *pcVar8;
  long lVar9;
  size_t sVar10;
  int (*paaiVar11) [5] [5];
  long lVar12;
  int (*paaiVar13) [5] [5];
  int (*paaiVar14) [5] [5];
  int iVar15;
  uint uVar16;
  double (*padVar17) [5];
  double (*padVar18) [8];
  int (*paaiVar19) [5] [5];
  double (*paaadVar20) [8] [5] [5];
  double (*paaadVar21) [8] [5] [5];
  double (*paaaadVar22) [8] [5] [5] [5];
  double (*paaaadVar23) [8] [5] [5] [5];
  long lVar24;
  int (*paaiVar25) [5] [5];
  int (*paaiVar26) [5] [5];
  int (*paaiVar27) [5] [5];
  int (*paaiVar28) [5] [5];
  int (*paaiVar29) [5] [5];
  int (*paaiVar30) [5] [5];
  int (*paiVar31) [5];
  int (*paaiVar32) [5] [5];
  double (*paaaaadVar33) [8] [5] [5] [5] [5];
  double (*paaaaadVar34) [8] [5] [5] [5] [5];
  int m;
  int iVar35;
  uint uVar36;
  int (*paiVar37) [5];
  long lVar38;
  long lVar39;
  long lVar40;
  int (*paiVar41) [8];
  vrna_exp_param_t *pvVar42;
  int (*paiVar43) [5];
  int (*paiVar44) [8];
  int (*paaiVar45) [5] [5];
  int (*paiVar46) [5];
  undefined4 uVar47;
  undefined4 uVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  int (*local_120) [5];
  int (*local_100) [5];
  int (*local_f8) [5];
  int (*local_f0) [5];
  double (*local_e8) [8] [5] [5];
  int (*local_e0) [5];
  int (*local_d8) [5];
  double (*local_d0) [8] [5] [5] [5] [5];
  double (*local_c8) [8] [5] [5] [5];
  int (*local_c0) [5];
  int (*local_b8) [5];
  int (*local_a8) [5];
  vrna_exp_param_t *local_a0;
  int (*local_98) [5];
  int (*local_90) [5];
  double (*local_88) [8] [5] [5] [5] [5];
  
  pvVar7 = (vrna_exp_param_t *)vrna_alloc(0x66760);
  memset(pvVar7->param_file,0,0x100);
  pcVar8 = last_parameter_file();
  if (pcVar8 != (char *)0x0) {
    pcVar8 = last_parameter_file();
    strncpy(pvVar7->param_file,pcVar8,0xff);
  }
  memcpy(&pvVar7->model_details,md,0x7e8);
  uVar1 = md->temperature;
  uVar2 = md->betaScale;
  pvVar7->temperature = (double)uVar1;
  pvVar7->alpha = (double)uVar2;
  dVar5 = (double)uVar2 * ((double)uVar1 + 273.15) * 1.98717;
  pvVar7->kT = dVar5;
  pvVar7->pf_scale = pfs;
  iVar3 = md->pf_smooth;
  dVar50 = ((double)uVar1 + 273.15) / Tmeasure;
  pvVar7->lxc = lxc37 * dVar50;
  dVar51 = (double)DuplexInitdH - (double)(DuplexInitdH - DuplexInit37) * dVar50;
  if (iVar3 == 0) {
    dVar51 = (double)(int)dVar51;
  }
  dVar51 = exp((dVar51 * -10.0) / dVar5);
  pvVar7->expDuplexInit = dVar51;
  dVar51 = (double)TerminalAUdH - (double)(TerminalAUdH - TerminalAU37) * dVar50;
  if (iVar3 == 0) {
    dVar51 = (double)(int)dVar51;
  }
  dVar51 = exp((dVar51 * -10.0) / dVar5);
  pvVar7->expTermAU = dVar51;
  dVar51 = (double)ML_BASEdH - (double)(ML_BASEdH - ML_BASE37) * dVar50;
  if (iVar3 == 0) {
    dVar51 = (double)(int)dVar51;
  }
  dVar51 = exp((dVar51 * -10.0) / dVar5);
  pvVar7->expMLbase = dVar51;
  dVar51 = (double)ML_closingdH - (double)(ML_closingdH - ML_closing37) * dVar50;
  if (iVar3 == 0) {
    dVar51 = (double)(int)dVar51;
  }
  dVar51 = exp((dVar51 * -10.0) / dVar5);
  pvVar7->expMLclosing = dVar51;
  dVar51 = (double)GQuadLayerMismatchH -
           (double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dVar50;
  if (iVar3 == 0) {
    dVar51 = (double)(int)dVar51;
  }
  dVar51 = exp((dVar51 * -10.0) / dVar5);
  pvVar7->expgquadLayerMismatch = dVar51;
  pvVar7->gquadLayerMismatchMax = GQuadLayerMismatchMax;
  local_120 = (int (*) [5])(pvVar7->expgquad[2] + 3);
  for (lVar9 = 2; lVar9 != 8; lVar9 = lVar9 + 1) {
    lVar40 = 0;
    while (iVar6 = GQuadBetadH, iVar4 = GQuadAlphadH, lVar40 != 0x2b) {
      iVar35 = GQuadAlphadH - GQuadAlpha37;
      iVar15 = GQuadBetadH - GQuadBeta37;
      dVar51 = log((double)(int)(lVar40 + 1));
      dVar51 = ((double)iVar6 - (double)iVar15 * dVar50) * dVar51 +
               ((double)iVar4 - (double)iVar35 * dVar50) * (double)((int)lVar9 - 1);
      if (iVar3 == 0) {
        dVar51 = (double)(int)dVar51;
      }
      dVar51 = exp((dVar51 * -10.0) / dVar5);
      *(double *)((long)local_120 + lVar40 * 8) = dVar51;
      lVar40 = lVar40 + 1;
    }
    local_120 = (int (*) [5])((long)local_120 + 0x170);
  }
  for (lVar9 = 0; lVar9 != 0x1f; lVar9 = lVar9 + 1) {
    dVar51 = (double)hairpindH[lVar9] - (double)(hairpindH[lVar9] - hairpin37[lVar9]) * dVar50;
    if (iVar3 == 0) {
      dVar51 = (double)(int)dVar51;
    }
    dVar51 = exp((dVar51 * -10.0) / dVar5);
    pvVar7->exphairpin[lVar9] = dVar51;
  }
  for (lVar9 = 0; lVar9 != 0x7c; lVar9 = lVar9 + 4) {
    dVar51 = (double)*(int *)((long)bulgedH + lVar9) -
             (double)(*(int *)((long)bulgedH + lVar9) - *(int *)((long)bulge37 + lVar9)) * dVar50;
    if (iVar3 == 0) {
      dVar51 = (double)(int)dVar51;
    }
    dVar51 = exp((dVar51 * -10.0) / dVar5);
    *(double *)((long)pvVar7->expbulge + lVar9 * 2) = dVar51;
    dVar51 = (double)*(int *)((long)internal_loopdH + lVar9) -
             (double)(*(int *)((long)internal_loopdH + lVar9) -
                     *(int *)((long)internal_loop37 + lVar9)) * dVar50;
    if (iVar3 == 0) {
      dVar51 = (double)(int)dVar51;
    }
    dVar51 = exp((dVar51 * -10.0) / dVar5);
    *(double *)((long)pvVar7->expinternal + lVar9 * 2) = dVar51;
  }
  if (james_rule != 0) {
    dVar51 = exp(-800.0 / dVar5);
    pvVar7->expinternal[2] = dVar51;
  }
  dVar51 = (double)niniodH - (double)(niniodH - ninio37) * dVar50;
  if (iVar3 == 0) {
    dVar51 = (double)(int)dVar51;
  }
  for (lVar9 = 0; lVar9 != 0x1f; lVar9 = lVar9 + 1) {
    dVar49 = (double)(int)lVar9 * dVar51;
    dVar52 = (double)MAX_NINIO;
    if (dVar49 <= (double)MAX_NINIO) {
      dVar52 = dVar49;
    }
    dVar52 = exp((dVar52 * -10.0) / dVar5);
    pvVar7->expninio[2][lVar9] = dVar52;
  }
  uVar16 = 0;
  uVar36 = 0;
  while( true ) {
    sVar10 = strlen(Tetraloops);
    if (sVar10 <= uVar16) break;
    dVar51 = (double)TetraloopdH[uVar36] -
             (double)(TetraloopdH[uVar36] - Tetraloop37[uVar36]) * dVar50;
    if (iVar3 == 0) {
      dVar51 = (double)(int)dVar51;
    }
    dVar51 = exp((dVar51 * -10.0) / dVar5);
    pvVar7->exptetra[uVar36] = dVar51;
    uVar36 = uVar36 + 1;
    uVar16 = uVar16 + 7;
  }
  uVar16 = 0;
  uVar36 = 0;
  while( true ) {
    sVar10 = strlen(Triloops);
    if (sVar10 <= uVar16) break;
    dVar51 = (double)TriloopdH[uVar36] - (double)(TriloopdH[uVar36] - Triloop37[uVar36]) * dVar50;
    if (iVar3 == 0) {
      dVar51 = (double)(int)dVar51;
    }
    dVar51 = exp((dVar51 * -10.0) / dVar5);
    pvVar7->exptri[uVar36] = dVar51;
    uVar36 = uVar36 + 1;
    uVar16 = uVar16 + 5;
  }
  uVar16 = 0;
  uVar36 = 0;
  while( true ) {
    sVar10 = strlen(Hexaloops);
    if (sVar10 <= uVar16) break;
    dVar51 = (double)HexaloopdH[uVar36] - (double)(HexaloopdH[uVar36] - Hexaloop37[uVar36]) * dVar50
    ;
    if (iVar3 == 0) {
      dVar51 = (double)(int)dVar51;
    }
    dVar51 = exp((dVar51 * -10.0) / dVar5);
    pvVar7->exphex[uVar36] = dVar51;
    uVar36 = uVar36 + 1;
    uVar16 = uVar16 + 9;
  }
  for (lVar9 = 0xc7fb; lVar9 != 0xc803; lVar9 = lVar9 + 1) {
    dVar51 = (double)ML_interndH - (double)(ML_interndH - ML_intern37) * dVar50;
    if (iVar3 == 0) {
      dVar51 = (double)(int)dVar51;
    }
    dVar51 = exp((dVar51 * -10.0) / dVar5);
    *(double *)((long)(pvVar7->expstack + -1) + 0x38 + lVar9 * 8) = dVar51;
  }
  padVar17 = pvVar7->expdangle5;
  local_b8 = dangle3_dH;
  paiVar43 = dangle3_37;
  paiVar31 = dangle5_dH;
  paiVar37 = dangle5_37;
  for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
    for (lVar40 = 0; lVar40 != 0x14; lVar40 = lVar40 + 4) {
      if (md->dangles == 0) {
        *(undefined8 *)((long)*padVar17 + lVar40 * 2) = 0x3ff0000000000000;
        uVar47 = 0;
        uVar48 = 0x3ff00000;
      }
      else {
        iVar4 = *(int *)((long)*paiVar31 + lVar40);
        dVar51 = (double)iVar4 - (double)(iVar4 - *(int *)((long)*paiVar37 + lVar40)) * dVar50;
        if (iVar3 == 0) {
          dVar52 = 0.0;
          if ((int)dVar51 < 1) {
            dVar52 = -(double)(int)dVar51;
          }
        }
        else {
          dVar49 = dVar51 / -10.0;
          dVar52 = 0.0;
          if (-1.2283697 <= dVar49) {
            if (dVar49 <= 0.8660254) {
              dVar51 = sin(dVar49 + -0.34242663);
              iVar4 = *(int *)((long)*paiVar31 + lVar40);
              dVar52 = sin(((double)iVar4 -
                           (double)(iVar4 - *(int *)((long)*paiVar37 + lVar40)) * dVar50) / -10.0 +
                           -0.34242663);
              dVar52 = (dVar52 + 1.0) * (dVar51 + 1.0) * 3.8490018;
            }
            else {
              dVar52 = -dVar51;
            }
          }
        }
        dVar51 = exp((dVar52 * 10.0) / dVar5);
        *(double *)((long)*padVar17 + lVar40 * 2) = dVar51;
        iVar4 = *(int *)((long)*local_b8 + lVar40);
        dVar51 = (double)iVar4 - (double)(iVar4 - *(int *)((long)*paiVar43 + lVar40)) * dVar50;
        if (iVar3 == 0) {
          dVar52 = 0.0;
          if ((int)dVar51 < 1) {
            dVar52 = -(double)(int)dVar51;
          }
        }
        else {
          dVar49 = dVar51 / -10.0;
          dVar52 = 0.0;
          if (-1.2283697 <= dVar49) {
            if (dVar49 <= 0.8660254) {
              dVar51 = sin(dVar49 + -0.34242663);
              iVar4 = *(int *)((long)*local_b8 + lVar40);
              dVar52 = sin(((double)iVar4 -
                           (double)(iVar4 - *(int *)((long)*paiVar43 + lVar40)) * dVar50) / -10.0 +
                           -0.34242663);
              dVar52 = (dVar52 + 1.0) * (dVar51 + 1.0) * 3.8490018;
            }
            else {
              dVar52 = -dVar51;
            }
          }
        }
        dVar51 = exp((dVar52 * 10.0) / dVar5);
        uVar47 = SUB84(dVar51,0);
        uVar48 = (undefined4)((ulong)dVar51 >> 0x20);
      }
      *(ulong *)((long)padVar17[8] + lVar40 * 2) = CONCAT44(uVar48,uVar47);
    }
    padVar17 = padVar17 + 1;
    local_b8 = local_b8 + 1;
    paiVar43 = paiVar43 + 1;
    paiVar31 = paiVar31 + 1;
    paiVar37 = paiVar37 + 1;
  }
  padVar18 = pvVar7->expstack;
  paiVar41 = stackdH;
  paiVar44 = stack37;
  for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
    for (lVar40 = 0; lVar40 != 8; lVar40 = lVar40 + 1) {
      dVar51 = (double)(*paiVar41)[lVar40] -
               (double)((*paiVar41)[lVar40] - (*paiVar44)[lVar40]) * dVar50;
      if (iVar3 == 0) {
        dVar51 = (double)(int)dVar51;
      }
      dVar51 = exp((dVar51 * -10.0) / dVar5);
      (*padVar18)[lVar40] = dVar51;
    }
    padVar18 = padVar18 + 1;
    paiVar41 = paiVar41 + 1;
    paiVar44 = paiVar44 + 1;
  }
  paaiVar45 = mismatch1nIdH;
  paaiVar32 = mismatch1nI37;
  paaiVar19 = mismatchHdH;
  paaiVar11 = mismatchH37;
  paaiVar13 = mismatch23IdH;
  paaiVar14 = mismatch23I37;
  paaiVar25 = mismatchMdH;
  paaiVar26 = mismatchM37;
  paaiVar27 = mismatchExtdH;
  paaiVar28 = mismatchExt37;
  paaiVar29 = mismatchIdH;
  paaiVar30 = mismatchI37;
  local_a0 = pvVar7;
  for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
    lVar40 = 0;
    paiVar31 = *paaiVar19;
    paiVar37 = *paaiVar32;
    pvVar42 = local_a0;
    paiVar43 = *paaiVar45;
    local_120 = *paaiVar29;
    local_100 = *paaiVar27;
    local_f8 = *paaiVar14;
    local_f0 = *paaiVar28;
    local_e0 = *paaiVar13;
    local_d0 = (double (*) [8] [5] [5] [5] [5])paaiVar25;
    local_c8 = (double (*) [8] [5] [5] [5])paaiVar26;
    local_c0 = *paaiVar11;
    local_b8 = *paaiVar30;
    for (; lVar40 != 5; lVar40 = lVar40 + 1) {
      for (lVar38 = 0; lVar38 != 0x14; lVar38 = lVar38 + 4) {
        iVar4 = *(int *)((long)*(int (*) [5])*local_120 + lVar38);
        dVar51 = (double)iVar4 -
                 (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_b8 + lVar38)) * dVar50;
        if (iVar3 == 0) {
          dVar51 = (double)(int)dVar51;
        }
        dVar51 = exp((dVar51 * -10.0) / dVar5);
        *(double *)((long)pvVar42->expmismatchI[0][0] + lVar38 * 2) = dVar51;
        iVar4 = *(int *)((long)*(int (*) [5])*paiVar43 + lVar38);
        dVar51 = (double)iVar4 -
                 (double)(iVar4 - *(int *)((long)*(int (*) [5])*paiVar37 + lVar38)) * dVar50;
        if (iVar3 == 0) {
          dVar51 = (double)(int)dVar51;
        }
        dVar51 = exp((dVar51 * -10.0) / dVar5);
        *(double *)((long)pvVar42->expmismatch1nI[0][0] + lVar38 * 2) = dVar51;
        iVar4 = *(int *)((long)*(int (*) [5])*paiVar31 + lVar38);
        dVar51 = (double)iVar4 -
                 (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_c0 + lVar38)) * dVar50;
        if (iVar3 == 0) {
          dVar51 = (double)(int)dVar51;
        }
        dVar51 = exp((dVar51 * -10.0) / dVar5);
        *(double *)((long)pvVar42->expmismatchH[0][0] + lVar38 * 2) = dVar51;
        iVar4 = *(int *)((long)*(int (*) [5])*local_e0 + lVar38);
        dVar51 = (double)iVar4 -
                 (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_f8 + lVar38)) * dVar50;
        if (iVar3 == 0) {
          dVar51 = (double)(int)dVar51;
        }
        dVar51 = exp((dVar51 * -10.0) / dVar5);
        *(double *)((long)pvVar42->expmismatch23I[0][0] + lVar38 * 2) = dVar51;
        if (md->dangles == 0) {
          *(undefined8 *)((long)pvVar42->expmismatchExt[0][0] + lVar38 * 2) = 0x3ff0000000000000;
          lVar12 = 0x2430;
          uVar47 = 0;
          uVar48 = 0x3ff00000;
        }
        else {
          iVar4 = *(int *)((long)*(int (*) [5])*local_d0 + lVar38);
          dVar51 = (double)iVar4 -
                   (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_c8 + lVar38)) * dVar50;
          if (iVar3 == 0) {
            dVar52 = 0.0;
            if ((int)dVar51 < 1) {
              dVar52 = -(double)(int)dVar51;
            }
          }
          else {
            dVar49 = dVar51 / -10.0;
            dVar52 = 0.0;
            if (-1.2283697 <= dVar49) {
              if (dVar49 <= 0.8660254) {
                dVar51 = sin(dVar49 + -0.34242663);
                iVar4 = *(int *)((long)*(int (*) [5])*local_d0 + lVar38);
                dVar52 = sin(((double)iVar4 -
                             (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_c8 + lVar38)) *
                             dVar50) / -10.0 + -0.34242663);
                dVar52 = (dVar52 + 1.0) * (dVar51 + 1.0) * 3.8490018;
              }
              else {
                dVar52 = -dVar51;
              }
            }
          }
          dVar51 = exp((dVar52 * 10.0) / dVar5);
          *(double *)((long)pvVar42->expmismatchM[0][0] + lVar38 * 2) = dVar51;
          iVar4 = *(int *)((long)*(int (*) [5])*local_100 + lVar38);
          dVar51 = (double)iVar4 -
                   (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_f0 + lVar38)) * dVar50;
          if (iVar3 == 0) {
            dVar52 = 0.0;
            if ((int)dVar51 < 1) {
              dVar52 = -(double)(int)dVar51;
            }
          }
          else {
            dVar49 = dVar51 / -10.0;
            dVar52 = 0.0;
            if (-1.2283697 <= dVar49) {
              if (dVar49 <= 0.8660254) {
                dVar51 = sin(dVar49 + -0.34242663);
                iVar4 = *(int *)((long)*(int (*) [5])*local_100 + lVar38);
                dVar52 = sin(((double)iVar4 -
                             (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_f0 + lVar38)) *
                             dVar50) / -10.0 + -0.34242663);
                dVar52 = (dVar52 + 1.0) * (dVar51 + 1.0) * 3.8490018;
              }
              else {
                dVar52 = -dVar51;
              }
            }
          }
          dVar51 = exp((dVar52 * 10.0) / dVar5);
          uVar47 = SUB84(dVar51,0);
          uVar48 = (undefined4)((ulong)dVar51 >> 0x20);
          lVar12 = 0x4f0;
        }
        *(ulong *)((long)(pvVar42->expstack + -1) + 0x38 + lVar38 * 2 + lVar12) =
             CONCAT44(uVar48,uVar47);
      }
      pvVar42 = (vrna_exp_param_t *)(pvVar42->expstack[0] + 4);
      paiVar43 = paiVar43 + 1;
      paiVar37 = paiVar37 + 1;
      paiVar31 = paiVar31 + 1;
      local_c0 = local_c0 + 1;
      local_e0 = local_e0 + 1;
      local_f8 = local_f8 + 1;
      local_d0 = (double (*) [8] [5] [5] [5] [5])((long)local_d0 + 0x14);
      local_c8 = (double (*) [8] [5] [5] [5])((long)local_c8 + 0x14);
      local_100 = local_100 + 1;
      local_f0 = local_f0 + 1;
      local_120 = local_120 + 1;
      local_b8 = local_b8 + 1;
    }
    local_a0 = (vrna_exp_param_t *)(local_a0->expstack + 3);
    paaiVar45 = (int (*) [5] [5])((long)paaiVar45 + 100);
    paaiVar32 = (int (*) [5] [5])((long)paaiVar32 + 100);
    paaiVar19 = (int (*) [5] [5])((long)paaiVar19 + 100);
    paaiVar11 = (int (*) [5] [5])((long)paaiVar11 + 100);
    paaiVar13 = (int (*) [5] [5])((long)paaiVar13 + 100);
    paaiVar14 = (int (*) [5] [5])((long)paaiVar14 + 100);
    paaiVar25 = (int (*) [5] [5])((long)paaiVar25 + 100);
    paaiVar26 = (int (*) [5] [5])((long)paaiVar26 + 100);
    paaiVar27 = (int (*) [5] [5])((long)paaiVar27 + 100);
    paaiVar28 = (int (*) [5] [5])((long)paaiVar28 + 100);
    paaiVar29 = (int (*) [5] [5])((long)paaiVar29 + 100);
    paaiVar30 = (int (*) [5] [5])((long)paaiVar30 + 100);
  }
  local_e8 = pvVar7->expint11;
  local_f0 = (int (*) [5])int11_dH;
  local_100 = (int (*) [5])int11_37;
  for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
    paaadVar20 = local_e8;
    paiVar31 = local_f0;
    paiVar37 = local_100;
    for (lVar40 = 0; lVar40 != 8; lVar40 = lVar40 + 1) {
      paaadVar21 = paaadVar20;
      paiVar43 = paiVar31;
      paiVar46 = paiVar37;
      for (lVar38 = 0; lVar38 != 5; lVar38 = lVar38 + 1) {
        for (lVar12 = 0; lVar12 != 5; lVar12 = lVar12 + 1) {
          iVar4 = (*(int (*) [5] [5])*paiVar43)[0][lVar12];
          dVar51 = (double)iVar4 -
                   (double)(iVar4 - (*(int (*) [5] [5])*paiVar46)[0][lVar12]) * dVar50;
          if (iVar3 == 0) {
            dVar51 = (double)(int)dVar51;
          }
          dVar51 = exp((dVar51 * -10.0) / dVar5);
          (*paaadVar21)[0][0][lVar12] = dVar51;
        }
        paaadVar21 = (double (*) [8] [5] [5])((*paaadVar21)[0] + 1);
        paiVar43 = paiVar43 + 1;
        paiVar46 = paiVar46 + 1;
      }
      paaadVar20 = (double (*) [8] [5] [5])(*paaadVar20 + 1);
      paiVar31 = paiVar31 + 5;
      paiVar37 = paiVar37 + 5;
    }
    local_e8 = local_e8 + 1;
    local_f0 = local_f0 + 0x28;
    local_100 = local_100 + 0x28;
  }
  local_d0 = (double (*) [8] [5] [5] [5] [5])pvVar7->expint21;
  local_d8 = (int (*) [5])int21_dH;
  local_a8 = (int (*) [5])int21_37;
  for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
    local_f0 = local_a8;
    local_100 = local_d8;
    local_c8 = (double (*) [8] [5] [5] [5])local_d0;
    for (lVar40 = 0; lVar40 != 8; lVar40 = lVar40 + 1) {
      paaaadVar22 = local_c8;
      paiVar31 = local_100;
      paiVar37 = local_f0;
      for (lVar38 = 0; lVar38 != 5; lVar38 = lVar38 + 1) {
        paaaadVar23 = paaaadVar22;
        paiVar43 = paiVar31;
        paiVar46 = paiVar37;
        for (lVar12 = 0; lVar12 != 5; lVar12 = lVar12 + 1) {
          for (lVar39 = 0; lVar39 != 5; lVar39 = lVar39 + 1) {
            iVar4 = (*(int (*) [5] [5] [5])*paiVar43)[0][0][lVar39];
            dVar51 = (double)iVar4 -
                     (double)(iVar4 - (*(int (*) [5] [5] [5])*paiVar46)[0][0][lVar39]) * dVar50;
            if (iVar3 == 0) {
              dVar51 = (double)(int)dVar51;
            }
            dVar51 = exp((dVar51 * -10.0) / dVar5);
            (*paaaadVar23)[0][0][0][lVar39] = dVar51;
          }
          paaaadVar23 = (double (*) [8] [5] [5] [5])((*paaaadVar23)[0][0] + 1);
          paiVar43 = paiVar43 + 1;
          paiVar46 = paiVar46 + 1;
        }
        paaaadVar22 = (double (*) [8] [5] [5] [5])((*paaaadVar22)[0] + 1);
        paiVar31 = paiVar31 + 5;
        paiVar37 = paiVar37 + 5;
      }
      local_c8 = (double (*) [8] [5] [5] [5])(*local_c8 + 1);
      local_100 = local_100 + 0x19;
      local_f0 = local_f0 + 0x19;
    }
    local_d0 = (double (*) [8] [5] [5] [5] [5])((long)local_d0 + 8000);
    local_d8 = local_d8 + 200;
    local_a8 = local_a8 + 200;
  }
  local_88 = pvVar7->expint22;
  local_90 = (int (*) [5])int22_dH;
  local_98 = (int (*) [5])int22_37;
  for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
    local_d8 = local_98;
    local_a8 = local_90;
    local_a0 = (vrna_exp_param_t *)local_88;
    for (lVar40 = 0; lVar40 != 8; lVar40 = lVar40 + 1) {
      local_100 = local_d8;
      local_c8 = (double (*) [8] [5] [5] [5])local_a8;
      local_d0 = (double (*) [8] [5] [5] [5] [5])local_a0;
      for (lVar38 = 0; lVar38 != 5; lVar38 = lVar38 + 1) {
        paaaaadVar33 = local_d0;
        paiVar31 = (int (*) [5])local_c8;
        paiVar37 = local_100;
        for (lVar12 = 0; lVar12 != 5; lVar12 = lVar12 + 1) {
          paaaaadVar34 = paaaaadVar33;
          paiVar43 = paiVar31;
          paiVar46 = paiVar37;
          for (lVar39 = 0; lVar39 != 5; lVar39 = lVar39 + 1) {
            for (lVar24 = 0; lVar24 != 5; lVar24 = lVar24 + 1) {
              iVar4 = (*(int (*) [5] [5] [5] [5])*paiVar43)[0][0][0][lVar24];
              dVar51 = (double)iVar4 -
                       (double)(iVar4 - (*(int (*) [5] [5] [5] [5])*paiVar46)[0][0][0][lVar24]) *
                       dVar50;
              if (iVar3 == 0) {
                dVar51 = (double)(int)dVar51;
              }
              dVar51 = exp((dVar51 * -10.0) / dVar5);
              (*paaaaadVar34)[0][0][0][0][lVar24] = dVar51;
            }
            paaaaadVar34 = (double (*) [8] [5] [5] [5] [5])((*paaaaadVar34)[0][0][0] + 1);
            paiVar43 = paiVar43 + 1;
            paiVar46 = paiVar46 + 1;
          }
          paaaaadVar33 = (double (*) [8] [5] [5] [5] [5])((*paaaaadVar33)[0][0] + 1);
          paiVar31 = paiVar31 + 5;
          paiVar37 = paiVar37 + 5;
        }
        local_d0 = (double (*) [8] [5] [5] [5] [5])((*local_d0)[0] + 1);
        local_c8 = (double (*) [8] [5] [5] [5])((long)local_c8 + 500);
        local_100 = local_100 + 0x19;
      }
      local_a0 = (vrna_exp_param_t *)((double (*) [5] [5] [5] [5])&local_a0->id + 1);
      local_a8 = local_a8 + 0x7d;
      local_d8 = local_d8 + 0x7d;
    }
    local_88 = local_88 + 1;
    local_90 = local_90 + 1000;
    local_98 = local_98 + 1000;
  }
  strncpy(pvVar7->Tetraloops,Tetraloops,0x119);
  strncpy(pvVar7->Triloops,Triloops,0xf1);
  strncpy(pvVar7->Hexaloops,Hexaloops,0x169);
  return pvVar7;
}

Assistant:

PRIVATE vrna_exp_param_t *
get_scaled_exp_params(vrna_md_t *md,
                      double    pfs)
{
  unsigned int      i, j, k, l;
  int               pf_smooth;
  double            kT, TT;
  double            GT;
  vrna_exp_param_t  *pf;

  pf = (vrna_exp_param_t *)vrna_alloc(sizeof(vrna_exp_param_t));

  memset(pf->param_file, '\0', 256);
  if (last_parameter_file() != NULL)
    strncpy(pf->param_file, last_parameter_file(), 255);

  pf->model_details = *md;
  pf->temperature   = md->temperature;
  pf->alpha         = md->betaScale;
  pf->kT            = kT = md->betaScale * (md->temperature + K0) * GASCONST; /* kT in cal/mol  */
  pf->pf_scale      = pfs;
  pf_smooth         = md->pf_smooth;
  TT                = (md->temperature + K0) / (Tmeasure);

  pf->lxc                   = lxc37 * TT;
  pf->expDuplexInit         = RESCALE_BF(DuplexInit37, DuplexInitdH, TT, kT);
  pf->expTermAU             = RESCALE_BF(TerminalAU37, TerminalAUdH, TT, kT);
  pf->expMLbase             = RESCALE_BF(ML_BASE37, ML_BASEdH, TT, kT);
  pf->expMLclosing          = RESCALE_BF(ML_closing37, ML_closingdH, TT, kT);
  pf->expgquadLayerMismatch = RESCALE_BF(GQuadLayerMismatch37, GQuadLayerMismatchH, TT, kT);
  pf->gquadLayerMismatchMax = GQuadLayerMismatchMax;

  for (i = VRNA_GQUAD_MIN_STACK_SIZE; i <= VRNA_GQUAD_MAX_STACK_SIZE; i++)
    for (j = 3 * VRNA_GQUAD_MIN_LINKER_LENGTH; j <= 3 * VRNA_GQUAD_MAX_LINKER_LENGTH; j++) {
      double  GQuadAlpha_T  = RESCALE_dG(GQuadAlpha37, GQuadAlphadH, TT);
      double  GQuadBeta_T   = RESCALE_dG(GQuadBeta37, GQuadBetadH, TT);
      GT = ((double)GQuadAlpha_T) * ((double)(i - 1)) + ((double)GQuadBeta_T) *
           log(((double)j) - 2.);
      pf->expgquad[i][j] = exp(-TRUNC_MAYBE(GT) * 10. / kT);
    }

  /* loop energies: hairpins, bulges, interior, mulit-loops */
  for (i = 0; i < 31; i++)
    pf->exphairpin[i] = RESCALE_BF(hairpin37[i], hairpindH[i], TT, kT);

  for (i = 0; i <= MIN2(30, MAXLOOP); i++) {
    pf->expbulge[i]     = RESCALE_BF(bulge37[i], bulgedH[i], TT, kT);
    pf->expinternal[i]  = RESCALE_BF(internal_loop37[i], internal_loopdH[i], TT, kT);
  }

  /* special case of size 2 interior loops (single mismatch) */
  if (james_rule)
    pf->expinternal[2] = exp(-80 * 10. / kT);

  GT = RESCALE_dG(bulge37[30],
                  bulgedH[30],
                  TT);
  for (i = 31; i <= MAXLOOP; i++)
    pf->expbulge[i] = exp(-TRUNC_MAYBE(GT + (pf->lxc * log(i / 30.))) * 10. / kT);

  GT = RESCALE_dG(internal_loop37[30],
                  internal_loopdH[30],
                  TT);
  for (i = 31; i <= MAXLOOP; i++)
    pf->expinternal[i] = exp(-TRUNC_MAYBE(GT + (pf->lxc * log(i / 30.))) * 10. / kT);

  GT = RESCALE_dG(ninio37, niniodH, TT);
  for (j = 0; j <= MAXLOOP; j++)
    pf->expninio[2][j] = exp(-MIN2(MAX_NINIO, j * TRUNC_MAYBE(GT)) * 10. / kT);

  for (i = 0; (i * 7) < strlen(Tetraloops); i++)
    pf->exptetra[i] = RESCALE_BF(Tetraloop37[i], TetraloopdH[i], TT, kT);

  for (i = 0; (i * 5) < strlen(Triloops); i++)
    pf->exptri[i] = RESCALE_BF(Triloop37[i], TriloopdH[i], TT, kT);

  for (i = 0; (i * 9) < strlen(Hexaloops); i++)
    pf->exphex[i] = RESCALE_BF(Hexaloop37[i], HexaloopdH[i], TT, kT);

  for (i = 0; i <= NBPAIRS; i++)
    pf->expMLintern[i] = RESCALE_BF(ML_intern37, ML_interndH, TT, kT);

  /* if dangles==0 just set their energy to 0,
   * don't let dangle energies become > 0 (at large temps),
   * but make sure go smoothly to 0                        */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= 4; j++) {
      if (md->dangles) {
        pf->expdangle5[i][j]  = RESCALE_BF_SMOOTH(dangle5_37[i][j], dangle5_dH[i][j], TT, kT);
        pf->expdangle3[i][j]  = RESCALE_BF_SMOOTH(dangle3_37[i][j], dangle3_dH[i][j], TT, kT);
      } else {
        pf->expdangle3[i][j] = pf->expdangle5[i][j] = 1;
      }
    }

  /* stacking energies */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      pf->expstack[i][j] = RESCALE_BF(stack37[i][j], stackdH[i][j], TT, kT);

  /* mismatch energies */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j < 5; j++)
      for (k = 0; k < 5; k++) {
        pf->expmismatchI[i][j][k] = RESCALE_BF(mismatchI37[i][j][k],
                                               mismatchIdH[i][j][k],
                                               TT,
                                               kT);
        pf->expmismatch1nI[i][j][k] = RESCALE_BF(mismatch1nI37[i][j][k],
                                                 mismatch1nIdH[i][j][k],
                                                 TT,
                                                 kT);
        pf->expmismatchH[i][j][k] = RESCALE_BF(mismatchH37[i][j][k],
                                               mismatchHdH[i][j][k],
                                               TT,
                                               kT);
        pf->expmismatch23I[i][j][k] = RESCALE_BF(mismatch23I37[i][j][k],
                                                 mismatch23IdH[i][j][k],
                                                 TT,
                                                 kT);

        if (md->dangles) {
          pf->expmismatchM[i][j][k] = RESCALE_BF_SMOOTH(mismatchM37[i][j][k],
                                                        mismatchMdH[i][j][k],
                                                        TT,
                                                        kT);
          pf->expmismatchExt[i][j][k] = RESCALE_BF_SMOOTH(mismatchExt37[i][j][k],
                                                          mismatchExtdH[i][j][k],
                                                          TT,
                                                          kT);
        } else {
          pf->expmismatchM[i][j][k] = pf->expmismatchExt[i][j][k] = 1.;
        }
      }

  /* interior lops of length 2 */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          pf->expint11[i][j][k][l] = RESCALE_BF(int11_37[i][j][k][l],
                                                int11_dH[i][j][k][l],
                                                TT,
                                                kT);
        }

  /* interior 2x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m;
          for (m = 0; m < 5; m++) {
            pf->expint21[i][j][k][l][m] = RESCALE_BF(int21_37[i][j][k][l][m],
                                                     int21_dH[i][j][k][l][m],
                                                     TT,
                                                     kT);
          }
        }

  /* interior 2x2 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m, n;
          for (m = 0; m < 5; m++)
            for (n = 0; n < 5; n++) {
              pf->expint22[i][j][k][l][m][n] = RESCALE_BF(int22_37[i][j][k][l][m][n],
                                                          int22_dH[i][j][k][l][m][n],
                                                          TT,
                                                          kT);
            }
        }

  strncpy(pf->Tetraloops, Tetraloops, 281);
  strncpy(pf->Triloops, Triloops, 241);
  strncpy(pf->Hexaloops, Hexaloops, 361);

  return pf;
}